

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O0

bool matchit::impl::
     matchPatternRangeImpl<0ul,0ul,1ul,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>&,std::tuple<matchit::impl::Ds<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Ds<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>const&,matchit::impl::Context<mathiu::impl::Product_const*,bool>>
               (tuple<matchit::impl::Ds<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Ds<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                *rangeBegin,
               tuple<matchit::impl::Ds<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Ds<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
               *patternTuple,undefined4 depth,Context<const_mathiu::impl::Product_*,_bool> *context)

{
  enable_if_t<isTupleLikeV<const_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_&>,_bool>
  eVar1;
  reference ppVar2;
  __tuple_element_t<0UL,_tuple<Ds<shared_ptr<const_Expr>,_shared_ptr<const_Expr>_>,_Ds<shared_ptr<const_Expr>,_shared_ptr<const_Expr>_>_>_>
  *pattern;
  __tuple_element_t<1UL,_tuple<Ds<shared_ptr<const_Expr>,_shared_ptr<const_Expr>_>,_Ds<shared_ptr<const_Expr>,_shared_ptr<const_Expr>_>_>_>
  *pattern_00;
  enable_if_t<isTupleLikeV<const_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_&>,_bool>
  local_61;
  _Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  local_58;
  _Base_ptr local_50;
  _Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  local_48;
  long local_40;
  anon_class_16_2_afc162f5 func;
  Context<const_mathiu::impl::Product_*,_bool> *context_local;
  tuple<matchit::impl::Ds<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Ds<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  *ptStack_20;
  int32_t depth_local;
  tuple<matchit::impl::Ds<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Ds<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  *patternTuple_local;
  _Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  *rangeBegin_local;
  
  local_40 = (long)&context_local + 4;
  local_50 = *(_Base_ptr *)
              &(rangeBegin->
               super__Tuple_impl<0UL,_matchit::impl::Ds<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Ds<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
               ).
               super__Tuple_impl<1UL,_matchit::impl::Ds<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
               .
               super__Head_base<1UL,_matchit::impl::Ds<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_false>
               ._M_head_impl.mPatterns.
               super__Tuple_impl<0UL,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
               .super__Tuple_impl<1UL,_std::shared_ptr<const_mathiu::impl::Expr>_>;
  func.depth = (int32_t *)context;
  func.context = context;
  context_local._4_4_ = depth;
  ptStack_20 = patternTuple;
  patternTuple_local = rangeBegin;
  local_48 = std::
             next<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>
                       (local_50,0);
  ppVar2 = std::
           _Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
           ::operator*(&local_48);
  pattern = std::
            get<0ul,matchit::impl::Ds<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Ds<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>
                      (ptStack_20);
  eVar1 = matchPatternRangeImpl<0ul,0ul,1ul,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>&,std::tuple<matchit::impl::Ds<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Ds<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>const&,matchit::impl::Context<mathiu::impl::Product_const*,bool>>(std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>&,std::tuple<matchit::impl::Ds<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Ds<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>const&,int,matchit::impl::Context<mathiu::impl::Product_const*,bool>&,std::integer_sequence<unsigned_long,0ul,1ul>)
          ::{lambda(auto:1&&,auto:2&&)#1}::operator()(&local_40,ppVar2,pattern);
  local_61 = false;
  if (eVar1) {
    local_58 = std::
               next<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>
                         (*(_Base_ptr *)
                           &(patternTuple_local->
                            super__Tuple_impl<0UL,_matchit::impl::Ds<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Ds<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                            ).
                            super__Tuple_impl<1UL,_matchit::impl::Ds<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                            .
                            super__Head_base<1UL,_matchit::impl::Ds<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_false>
                            ._M_head_impl.mPatterns.
                            super__Tuple_impl<0UL,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
                            .super__Tuple_impl<1UL,_std::shared_ptr<const_mathiu::impl::Expr>_>,1);
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
             ::operator*(&local_58);
    pattern_00 = std::
                 get<1ul,matchit::impl::Ds<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Ds<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>
                           (ptStack_20);
    local_61 = matchPatternRangeImpl<0ul,0ul,1ul,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>&,std::tuple<matchit::impl::Ds<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Ds<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>const&,matchit::impl::Context<mathiu::impl::Product_const*,bool>>(std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>&,std::tuple<matchit::impl::Ds<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Ds<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>const&,int,matchit::impl::Context<mathiu::impl::Product_const*,bool>&,std::integer_sequence<unsigned_long,0ul,1ul>)
               ::{lambda(auto:1&&,auto:2&&)#1}::operator()(&local_40,ppVar2,pattern_00);
  }
  return local_61;
}

Assistant:

constexpr decltype(auto) matchPatternRangeImpl(RangeBegin &&rangeBegin,
                                                       PatternTuple &&patternTuple,
                                                       int32_t depth, ContextT &context,
                                                       std::index_sequence<I...>)
        {
            auto const func = [&](auto &&value, auto &&pattern)
            {
                return matchPattern(std::forward<decltype(value)>(value), pattern,
                                    depth + 1, context);
            };
            static_cast<void>(func);
            // Fix Me, avoid call next from begin every time.
            return (func(*std::next(rangeBegin, static_cast<long>(I)),
                         std::get<I + patternStartIdx>(patternTuple)) &&
                    ...);
        }